

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O2

void __thiscall ANNkd_tree::SkeletonTree(ANNkd_tree *this,int n,int dd,int bs)

{
  ANNidxArray pAVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->dim = dd;
  this->n_pts = n;
  this->bkt_size = bs;
  this->root = (ANNkd_ptr)0x0;
  this->pts = (ANNpointArray)0x0;
  uVar4 = 0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (ulong)(uint)n << 2;
  }
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar4;
  }
  pAVar1 = (ANNidxArray)operator_new__(uVar2);
  this->pidx = pAVar1;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pAVar1[uVar4] = (ANNidx)uVar4;
  }
  this->bnd_box_lo = (ANNpoint)0x0;
  this->bnd_box_hi = (ANNpoint)0x0;
  if (KD_TRIVIAL == (ANNkd_leaf *)0x0) {
    KD_TRIVIAL = (ANNkd_leaf *)operator_new(0x18);
    (KD_TRIVIAL->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_node_0010ad28;
    KD_TRIVIAL->n_pts = 0;
    KD_TRIVIAL->bkt = IDX_TRIVIAL;
  }
  return;
}

Assistant:

void ANNkd_tree::SkeletonTree(  // construct skeleton tree
    int n,                      // number of points
    int dd,                     // dimension
    int bs)                     // bucket size
{
    dim = dd;  // initialize basic elements
    n_pts = n;
    bkt_size = bs;
    root = NULL;  // no associated tree yet
    pts = NULL;   // no associated points yet

    pidx = new int[n];  // allocate space for point indices
    for (int i = 0; i < n; i++) {
        pidx[i] = i;  // initially identity
    }
    bnd_box_lo = bnd_box_hi = NULL;  // bounding box is nonexistent
    if (KD_TRIVIAL == NULL)          // no trivial leaf node yet?
        KD_TRIVIAL = new ANNkd_leaf(0, IDX_TRIVIAL);  // allocate it
}